

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::Lex::MakeSyntaxTree<SGParser::Generator::RegExprDFANode>
          (Lex *this,DFASyntaxTree<SGParser::Generator::RegExprDFANode> *tree,String *regExpr,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
          *macroSyntaxTrees)

{
  bool bVar1;
  int iVar2;
  RegExprDFANode *this_00;
  RegExprDFANode *this_01;
  RegExprDFAParseElement *pRVar3;
  Lex *this_02;
  InputStream local_310;
  pointer local_308;
  size_type sStack_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [8];
  Parse<SGParser::Generator::RegExprDFAParseElement> parse;
  RegExprDFANode *local_190;
  RegExprDFANode *pnodeAccept;
  undefined1 local_110 [8];
  RegExpTokenizer<SGParser::Generator::RegExprParseToken> tokenizer;
  _Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
  _Stack_b0;
  String local_98;
  String local_78;
  String local_58;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this_02 = this;
  if (MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
      ::parseTable == '\0') {
    this_02 = (Lex *)&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
                      ::parseTable;
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      ParseTable::ParseTable
                (&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.super_ParseTable);
      __cxa_atexit(ParseTable::~ParseTable,
                   &MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable,&__dso_handle);
      this_02 = (Lex *)&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>(SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>&,std::__cxx11::string_const&,std::map<std::__cxx11::string,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>*>>>&)
                        ::parseTable;
      __cxa_guard_release();
    }
  }
  if (MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.super_ParseTable.Type == None)
  {
    parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream =
         (_func_int **)&parse;
    parse.pParseTable._0_4_ = 0;
    parse.pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
    parse.Stream.pFirstBlock = (StreamBlock *)0x0;
    parse.Stream.LengthLeft = (size_t)&parse.Stream.ThisPos;
    parse.Stream.ThisPos._0_4_ = 0;
    parse.Stream.RememberLength = 0;
    parse.StackPosition =
         (long)&parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header + 0x18;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parse.Stream.SourceEOFFlag = false;
    parse.Stream._65_7_ = 0;
    parse.Stream.Markers._M_t._M_impl._0_8_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    parse.Stream.Markers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parse.pValidTokenStackPositions = (size_t *)&parse.Token;
    parse.Token.super_TokenCode.Code = 0;
    parse.ReduceLeft = 0;
    parse._188_4_ = 0;
    parse.pStack = (RegExprDFAParseElement *)0x0;
    parse.TopState = 0;
    parse.NextTokenFlag = false;
    parse._165_3_ = 0;
    parse.ErrorStackStr._M_string_length = 0;
    parse.ErrorStackStr.field_2._M_allocated_capacity = 0;
    parse.LastErrorState = 0;
    parse._212_4_ = 0;
    parse.ErrorStackStr._M_dataplus._M_p = (pointer)0x0;
    parse.ErrorStackStr.field_2._8_4_ = 0;
    parse.Stream.pSourceStream =
         (TokenStream<SGParser::Generator::RegExprParseToken> *)
         parse.Stream.super_TokenStream<SGParser::Generator::RegExprParseToken>._vptr_TokenStream;
    parse.Stream.Pos = parse.Stream.LengthLeft;
    parse.StackSize = parse.StackPosition;
    parse.ErrorMarker = (size_t)parse.pValidTokenStackPositions;
    CreateRegExpGrammar(this_02,(Grammar *)local_2f0);
    bVar1 = ParseTableGen::Create
                      (&MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable,
                       (Grammar *)local_2f0,CLR);
    Grammar::~Grammar((Grammar *)local_2f0);
    if (!bVar1) {
      return false;
    }
  }
  local_308 = (regExpr->_M_dataplus)._M_p;
  sStack_300 = regExpr->_M_string_length;
  local_310._vptr_InputStream = (_func_int **)&PTR__MemBufferInputStream_0015a2e0;
  local_2f8 = 0;
  RegExpTokenizer<SGParser::Generator::RegExprParseToken>::RegExpTokenizer
            ((RegExpTokenizer<SGParser::Generator::RegExprParseToken> *)local_110,&local_310);
  Parse<SGParser::Generator::RegExprDFAParseElement>::Parse
            ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_2f0,
             &MakeSyntaxTree<SGParser::Generator::RegExprDFANode>::parseTable.super_ParseTable,
             (TokenStream<SGParser::Generator::RegExprParseToken> *)local_110,0x800);
  tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>._56_8_ =
       &PTR__RegExprDFAParseHandler_0015cd80;
  _Stack_b0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_b0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_b0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = Parse<SGParser::Generator::RegExprDFAParseElement>::DoParse
                    ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_2f0,
                     (ParseHandler<SGParser::Generator::RegExprDFAParseElement> *)
                     &tokenizer.super_TokenizerImpl<SGParser::Generator::RegExprParseToken>.
                      field_0x38);
  if (bVar1) {
    this_00 = (RegExprDFANode *)operator_new(0x80);
    RegExprDFANode::RegExprDFANode(this_00,Char,0,1);
    this_00->AcceptingState = 1;
    local_190 = this_00;
    this_01 = (RegExprDFANode *)operator_new(0x80);
    this_01->Type = And;
    this_01->ID = 0;
    this_01->Position = 0;
    (this_01->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(this_01->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(this_01->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (this_01->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_01->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01->pParent = (RegExprDFANode *)0x0;
    (this_01->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar3 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_2f0,0);
    RegExprDFANode::Add(this_01,(pRVar3->field_1).pNode);
    RegExprDFANode::Add(this_01,this_00);
    RegExprDFANode::Setup(this_01);
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::push_back((vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                 *)&_Stack_b0,&stack0xfffffffffffffe70);
    tree->pRoot = this_01;
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::operator=(&tree->CharNodes,
                (vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                 *)&_Stack_b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_32);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"DFA Syntax Tree: Regular expression parsing error",&local_31);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    ParseMessage::ParseMessage
              ((ParseMessage *)&stack0xfffffffffffffe70,ErrorMessage,&local_98,&local_78,0,
               0xffffffffffffffff,0xffffffffffffffff,&local_58,0);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)&stack0xfffffffffffffe70);
    ParseMessage::~ParseMessage((ParseMessage *)&stack0xfffffffffffffe70);
  }
  std::
  _Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
  ::~_Vector_base(&_Stack_b0);
  Parse<SGParser::Generator::RegExprDFAParseElement>::~Parse
            ((Parse<SGParser::Generator::RegExprDFAParseElement> *)local_2f0);
  TokenizerBase::FreeAllBuffers((TokenizerBase *)&tokenizer);
  return bVar1;
}

Assistant:

bool Lex::MakeSyntaxTree(DFASyntaxTree<T>& tree, const String& regExpr,
                         std::map<String, DFASyntaxTree<T>*>& macroSyntaxTrees) {
    // Cache the parse table
    static ParseTableGen parseTable;

    if (!parseTable.IsValid()) {
        Grammar grammar;
        // Create the hard coded Regular Expression grammar
        CreateRegExpGrammar(grammar);

        // And make parse table out of it
        if (!parseTable.Create(grammar))
            return false; // Should probably throw exception
    }

    // Make an input stream with the regular expression string we've got
    MemBufferInputStream inputStream{regExpr};

    // Create a tokenizer to get input. Since we're giving it a nullptr lexeme list,
    // it will just return each character exactly as it appears in the input string
    RegExpTokenizer<RegExprParseToken> tokenizer{&inputStream};

    // Initialize Parsing
    Parse<RegExprDFAParseElement> parse{&parseTable, &tokenizer};
    RegExprDFAParseHandler        parseHandler;

    // Set the custom parse handler custom data
    parseHandler.LexemeID          = 0u;
    parseHandler.PositionCount     = 0u;
    parseHandler.pLex              = this;
    parseHandler.pMacroSyntaxTrees = &macroSyntaxTrees;

    // Let the parse class parse the regular expression using
    // using the custom parseHandler reduce callback
    if (!parse.DoParse(parseHandler)) {
        const ParseMessage msg{ParseMessage::ErrorMessage, "",
                               "DFA Syntax Tree: Regular expression parsing error"};
        Messages.AddMessage(msg);
        return false;
    }

    // Append the final accepting node
    // Make the fake accept character node
    const auto pnodeAccept      = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                     parseHandler.PositionCount++, 1u};
    pnodeAccept->AcceptingState = 1u;
    // Make the root node
    const auto pnodeRoot        = new RegExprDFANode{RegExprDFANode::NodeType::And};
    pnodeRoot->pParent          = nullptr;
    pnodeRoot->Add(parse[0].pNode);
    pnodeRoot->Add(pnodeAccept);
    pnodeRoot->Setup();

    // Add the accept node to the nodes list
    parseHandler.Nodes.push_back(pnodeAccept);

    // Set the destination tree data
    tree.pRoot     = pnodeRoot;
    tree.CharNodes = parseHandler.Nodes;

    return true;
}